

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O3

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_segment<winmd::reader::TypeDef,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,std::basic_string_view<char,std::char_traits<char>>>
          (writer_base<cppwinrt::writer> *this,string_view *value,TypeDef *first,
          coded_index<winmd::reader::TypeDefOrRef> *rest,
          basic_string_view<char,_std::char_traits<char>_> *rest_1)

{
  byte bVar1;
  size_type sVar2;
  void *__buf;
  ulong uVar3;
  string_view local_40;
  
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0,3);
  if (sVar2 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, std::basic_string_view<char>>]"
                 );
  }
  uVar3 = value->_M_len;
  if (sVar2 <= value->_M_len) {
    uVar3 = sVar2;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&this->m_first,
             (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,value->_M_str,value->_M_str + uVar3);
  bVar1 = value->_M_str[sVar2];
  if (bVar1 == 0x25) {
    writer::write((writer *)this,(int)first,__buf,(ulong)bVar1);
    uVar3 = sVar2 + 1;
    if (value->_M_len <= sVar2) goto LAB_00172dab;
    local_40._M_len = value->_M_len - uVar3;
    local_40._M_str = value->_M_str + uVar3;
    write_segment<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_40,rest,rest_1);
  }
  else {
    if (bVar1 != 0x5e) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x13d,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, std::basic_string_view<char>>]"
                   );
    }
    if (sVar2 == value->_M_len - 1) {
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, std::basic_string_view<char>>]"
                   );
    }
    write_impl(this,value->_M_str[sVar2 + 1]);
    uVar3 = sVar2 + 2;
    local_40._M_len = value->_M_len - uVar3;
    if (value->_M_len < uVar3) {
LAB_00172dab:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar3);
    }
    local_40._M_str = value->_M_str + uVar3;
    write_segment<winmd::reader::TypeDef,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_40,first,rest,rest_1);
  }
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }